

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *rhs,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator,bool copyConstStrings)

{
  ushort uVar1;
  uint uVar2;
  Ch *pCVar3;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  ushort uVar5;
  ulong uVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar7;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar8;
  StringRefType local_40;
  
  uVar1 = (rhs->data_).f.flags;
  uVar5 = uVar1 & 7;
  if (uVar5 == 5) {
    if (uVar1 != 0x405 || copyConstStrings) {
      uVar6 = *(ulong *)((long)&rhs->data_ + 8);
      if ((uVar1 >> 0xc & 1) == 0) {
        local_40.length = (rhs->data_).s.length;
        rhs = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(uVar6 & 0xffffffffffff);
      }
      else {
        local_40.length = 0xd - ((int)(uVar6 >> 0x10) >> 0x18);
      }
      local_40.s = (Ch *)&GenericStringRef<char>::emptyString;
      if (rhs != (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)0x0) {
        local_40.s = (Ch *)rhs;
      }
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetStringRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)this,&local_40,allocator);
      return;
    }
    *(undefined2 *)(this + 0xe) = 0x405;
  }
  else {
    if (uVar5 == 4) {
      uVar2 = (rhs->data_).s.length;
      uVar6 = (ulong)uVar2;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(allocator,uVar6 << 4);
      if (uVar6 != 0) {
        pGVar7 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((ulong)(rhs->data_).s.str & 0xffffffffffff);
        pGVar8 = pGVar4;
        do {
          GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (pGVar8,pGVar7,allocator,copyConstStrings);
          pGVar8 = pGVar8 + 0x10;
          pGVar7 = pGVar7 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      *(uint *)(this + 4) = uVar2;
      *(uint *)this = uVar2;
      *(ulong *)(this + 8) = (ulong)pGVar4 | 0x4000000000000;
      return;
    }
    if (uVar5 == 3) {
      uVar2 = (rhs->data_).s.length;
      uVar6 = (ulong)uVar2;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(allocator,uVar6 << 5);
      if (uVar6 != 0) {
        pGVar7 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((ulong)(rhs->data_).s.str & 0xffffffffffff);
        pGVar8 = pGVar4;
        do {
          GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (pGVar8,pGVar7,allocator,copyConstStrings);
          GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (pGVar8 + 0x10,pGVar7 + 1,allocator,copyConstStrings);
          pGVar8 = pGVar8 + 0x20;
          pGVar7 = pGVar7 + 2;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      *(uint *)(this + 4) = uVar2;
      *(uint *)this = uVar2;
      *(ulong *)(this + 8) = (ulong)pGVar4 | 0x3000000000000;
      return;
    }
    *(ushort *)(this + 0xe) = uVar1;
  }
  pCVar3 = (rhs->data_).s.str;
  *(Number *)this = (rhs->data_).n;
  *(Ch **)(this + 8) = pCVar3;
  return;
}

Assistant:

GenericValue(const GenericValue<Encoding,SourceAllocator>& rhs, Allocator& allocator, bool copyConstStrings = false) {
        switch (rhs.GetType()) {
        case kObjectType: {
                SizeType count = rhs.data_.o.size;
                Member* lm = reinterpret_cast<Member*>(allocator.Malloc(count * sizeof(Member)));
                const typename GenericValue<Encoding,SourceAllocator>::Member* rm = rhs.GetMembersPointer();
                for (SizeType i = 0; i < count; i++) {
                    new (&lm[i].name) GenericValue(rm[i].name, allocator, copyConstStrings);
                    new (&lm[i].value) GenericValue(rm[i].value, allocator, copyConstStrings);
                }
                data_.f.flags = kObjectFlag;
                data_.o.size = data_.o.capacity = count;
                SetMembersPointer(lm);
            }
            break;
        case kArrayType: {
                SizeType count = rhs.data_.a.size;
                GenericValue* le = reinterpret_cast<GenericValue*>(allocator.Malloc(count * sizeof(GenericValue)));
                const GenericValue<Encoding,SourceAllocator>* re = rhs.GetElementsPointer();
                for (SizeType i = 0; i < count; i++)
                    new (&le[i]) GenericValue(re[i], allocator, copyConstStrings);
                data_.f.flags = kArrayFlag;
                data_.a.size = data_.a.capacity = count;
                SetElementsPointer(le);
            }
            break;
        case kStringType:
            if (rhs.data_.f.flags == kConstStringFlag && !copyConstStrings) {
                data_.f.flags = rhs.data_.f.flags;
                data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            }
            else
                SetStringRaw(StringRef(rhs.GetString(), rhs.GetStringLength()), allocator);
            break;
        default:
            data_.f.flags = rhs.data_.f.flags;
            data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            break;
        }
    }